

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O2

ex_ex * ex_if(t_expr *e,ex_ex *eptr,ex_ex *optr,ex_ex *argv,int idx)

{
  ex_ex *peVar1;
  int iVar2;
  t_float *ptVar3;
  ex_ex *peVar4;
  t_float *ptVar5;
  long lVar6;
  t_float *ptVar7;
  long lVar8;
  undefined8 uVar9;
  char *fmt;
  t_float *ptVar10;
  t_float *ptVar11;
  t_float tVar12;
  float fVar13;
  t_float tVar14;
  
  peVar4 = ex_eval(e,eptr,argv,idx);
  peVar1 = argv + 1;
  lVar8 = argv->ex_type;
  if (lVar8 - 0xeU < 2) {
    if (optr->ex_type != 0xf) {
      if (optr->ex_type == 0xe) {
        uVar9 = 0x407;
        goto LAB_00192c33;
      }
      optr->ex_type = 0xf;
      ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar5;
      if (ptVar5 == (t_float *)0x0) {
        post("expr:if: no mem");
        return argv->ex_end->ex_end;
      }
    }
    peVar4 = ex_eval(e,peVar4,peVar1,idx);
    peVar1 = argv + 2;
    peVar4 = ex_eval(e,peVar4,peVar1,idx);
    ptVar5 = (optr->ex_cont).v_vec;
    iVar2 = e->exp_vsize;
    ptVar3 = (argv->ex_cont).v_vec;
    lVar8 = argv[1].ex_type;
    if (lVar8 - 0xeU < 2) {
      ptVar10 = argv[1].ex_cont.v_vec;
      lVar8 = argv[2].ex_type;
      if (lVar8 - 0xeU < 2) {
        ptVar7 = (peVar1->ex_cont).v_vec;
        for (lVar8 = 0; iVar2 != (int)lVar8; lVar8 = lVar8 + 1) {
          ptVar11 = ptVar7;
          if (ptVar3[lVar8] != 0.0) {
            ptVar11 = ptVar10;
          }
          if (NAN(ptVar3[lVar8])) {
            ptVar11 = ptVar10;
          }
          ptVar5[lVar8] = *ptVar11;
          ptVar10 = ptVar10 + 1;
          ptVar7 = ptVar7 + 1;
        }
        return peVar4;
      }
      if (lVar8 == 2) {
        tVar12 = (peVar1->ex_cont).v_flt;
        for (lVar8 = 0; iVar2 != (int)lVar8; lVar8 = lVar8 + 1) {
          if ((ptVar3[lVar8] != 0.0) || (tVar14 = tVar12, NAN(ptVar3[lVar8]))) {
            tVar14 = ptVar10[lVar8];
          }
          ptVar5[lVar8] = tVar14;
        }
        return peVar4;
      }
      if (lVar8 == 1) {
        lVar8 = (peVar1->ex_cont).v_int;
        for (lVar6 = 0; iVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
          if ((ptVar3[lVar6] != 0.0) || (tVar12 = (float)lVar8, NAN(ptVar3[lVar6]))) {
            tVar12 = ptVar10[lVar6];
          }
          ptVar5[lVar6] = tVar12;
        }
        return peVar4;
      }
      fmt = "expr: FUNC_EVAL(%d): bad right type %ld\n";
      uVar9 = 0x494;
    }
    else if (lVar8 == 2) {
      tVar12 = argv[1].ex_cont.v_flt;
      lVar8 = argv[2].ex_type;
      if (lVar8 - 0xeU < 2) {
        ptVar10 = (peVar1->ex_cont).v_vec;
        for (lVar8 = 0; iVar2 != (int)lVar8; lVar8 = lVar8 + 1) {
          tVar14 = tVar12;
          if ((ptVar3[lVar8] == 0.0) && (!NAN(ptVar3[lVar8]))) {
            tVar14 = ptVar10[lVar8];
          }
          ptVar5[lVar8] = tVar14;
        }
        return peVar4;
      }
      if (lVar8 == 2) {
        tVar14 = (peVar1->ex_cont).v_flt;
        for (lVar8 = 0; iVar2 != (int)lVar8; lVar8 = lVar8 + 1) {
          ptVar5[lVar8] =
               (t_float)(~-(uint)(ptVar3[lVar8] != 0.0) & (uint)tVar14 |
                        -(uint)(ptVar3[lVar8] != 0.0) & (uint)tVar12);
        }
        return peVar4;
      }
      if (lVar8 == 1) {
        lVar8 = (peVar1->ex_cont).v_int;
        for (lVar6 = 0; iVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
          ptVar5[lVar6] =
               (t_float)(~-(uint)(ptVar3[lVar6] != 0.0) & (uint)(float)lVar8 |
                        -(uint)(ptVar3[lVar6] != 0.0) & (uint)tVar12);
        }
        return peVar4;
      }
      fmt = "expr: FUNC_EVAL(%d): bad right type %ld\n";
      uVar9 = 0x46a;
    }
    else if (lVar8 == 1) {
      fVar13 = (float)argv[1].ex_cont.v_int;
      lVar8 = argv[2].ex_type;
      if (lVar8 - 0xeU < 2) {
        ptVar10 = (peVar1->ex_cont).v_vec;
        for (lVar8 = 0; iVar2 != (int)lVar8; lVar8 = lVar8 + 1) {
          tVar12 = fVar13;
          if ((ptVar3[lVar8] == 0.0) && (!NAN(ptVar3[lVar8]))) {
            tVar12 = ptVar10[lVar8];
          }
          ptVar5[lVar8] = tVar12;
        }
        return peVar4;
      }
      if (lVar8 == 2) {
        tVar12 = (peVar1->ex_cont).v_flt;
        for (lVar8 = 0; iVar2 != (int)lVar8; lVar8 = lVar8 + 1) {
          ptVar5[lVar8] =
               (t_float)(~-(uint)(ptVar3[lVar8] != 0.0) & (uint)tVar12 |
                        -(uint)(ptVar3[lVar8] != 0.0) & (uint)fVar13);
        }
        return peVar4;
      }
      if (lVar8 == 1) {
        lVar8 = (peVar1->ex_cont).v_int;
        for (lVar6 = 0; iVar2 != (int)lVar6; lVar6 = lVar6 + 1) {
          ptVar5[lVar6] =
               (t_float)(~-(uint)(ptVar3[lVar6] != 0.0) & (uint)(float)lVar8 |
                        -(uint)(ptVar3[lVar6] != 0.0) & (uint)fVar13);
        }
        return peVar4;
      }
      fmt = "expr: FUNC_EVAL(%d): bad right type %ld\n";
      uVar9 = 0x443;
    }
    else {
      fmt = "expr: FUNC_EVAL(%d): bad left type %ld\n";
      uVar9 = 0x49b;
    }
    goto LAB_001930ac;
  }
  if (lVar8 == 1) {
    if ((argv->ex_cont).v_int == 0) goto LAB_00192bf0;
LAB_00192c46:
    peVar4 = ex_eval(e,peVar4,peVar1,idx);
    if (peVar4 == (ex_ex *)0x0) {
      return (ex_ex *)0x0;
    }
    peVar4 = peVar4->ex_end;
  }
  else {
    if (lVar8 != 2) {
      fmt = "expr: FUNC_EVAL(%d): bad condition type %ld\n";
      uVar9 = 0x4ae;
      goto LAB_001930ac;
    }
    if (((argv->ex_cont).v_flt != 0.0) || (NAN((argv->ex_cont).v_flt))) goto LAB_00192c46;
LAB_00192bf0:
    if (peVar4 == (ex_ex *)0x0) {
      return (ex_ex *)0x0;
    }
    peVar4 = ex_eval(e,peVar4->ex_end,peVar1,idx);
  }
  lVar8 = argv[1].ex_type;
  if (lVar8 - 0xeU < 2) {
    if (optr->ex_type != 0xe) {
      if (optr->ex_type == 0xf) {
        ptVar5 = (optr->ex_cont).v_vec;
      }
      else {
        optr->ex_type = 0xf;
        ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar5;
        if (ptVar5 == (t_float *)0x0) {
          post("expr:if: no mem");
          return peVar4;
        }
      }
      memcpy(ptVar5,(peVar1->ex_cont).v_vec,(long)e->exp_vsize << 2);
      return peVar4;
    }
    uVar9 = 0x4d5;
LAB_00192c33:
    post("expr~: Int. error %d",uVar9);
    return peVar4;
  }
  if (lVar8 == 2) {
    if (optr->ex_type != 0xf) {
LAB_00192e33:
      optr->ex_end = argv[1].ex_end;
      lVar8 = argv[1].ex_type;
      optr->ex_cont = peVar1->ex_cont;
      optr->ex_type = lVar8;
      return peVar4;
    }
    ptVar5 = (optr->ex_cont).v_vec;
    tVar12 = (peVar1->ex_cont).v_flt;
  }
  else {
    if (lVar8 != 1) {
      fmt = "expr: FUNC_EVAL(%d): bad res type %ld\n";
      uVar9 = 0x4e6;
LAB_001930ac:
      pd_error(e,fmt,uVar9);
      return peVar4;
    }
    if (optr->ex_type != 0xf) goto LAB_00192e33;
    ptVar5 = (optr->ex_cont).v_vec;
    tVar12 = (t_float)(peVar1->ex_cont).v_int;
  }
  ex_mkvector(ptVar5,tVar12,e->exp_vsize);
  return peVar4;
}

Assistant:

struct ex_ex *
ex_if(t_expr *e, struct ex_ex *eptr, struct ex_ex *optr, struct ex_ex *argv, int idx)
{
        struct ex_ex *left, *right, *cond, *res;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float *cp;              /* condition pointer */
        t_float leftvalue, rightvalue;
        int j;
                int condtrue = 0;

                // evaluate the condition
                eptr = ex_eval(e, eptr, argv, idx);
        cond = argv++;
                // only either the left or right will be evaluated depending
                // on the truth value of the condition
                // However, if the condition is a vector, both args will be evaluated

        switch (cond->ex_type) {
        case ET_VEC:
        case ET_VI:
                if (optr->ex_type != ET_VEC) {
                        if (optr->ex_type == ET_VI) {
                                /* SDY remove this test */
                                post("expr~: Int. error %d", __LINE__);
                                return (eptr);
                        }
                        optr->ex_type = ET_VEC;
                        optr->ex_vec = (t_float *)
                                  fts_malloc(sizeof (t_float) * e->exp_vsize);
                                                if (!optr->ex_vec) {
                                                        post("expr:if: no mem");
                                                        /* pass over the left and right args */
                                                        return(cond->ex_end->ex_end);
                                                }
                }
                                /*
                                 * if the condition is a vector
                                 * the left and the right args both will get processed
                                 */
                                eptr = ex_eval(e, eptr, argv, idx);
                                left = argv++;
                                eptr = ex_eval(e, eptr, argv, idx);
                                right = argv;
                op = optr->ex_vec;
                j = e->exp_vsize;
                cp = cond->ex_vec;
                switch (left->ex_type) {
                case ET_INT:
                        leftvalue = left->ex_int;
                        switch (right->ex_type) {
                        case ET_INT:
                                rightvalue = right->ex_int;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = rightvalue;
                                }
                        return (eptr);
                        case ET_FLT:
                                rightvalue = right->ex_flt;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = rightvalue;
                                }
                                return (eptr);
                        case ET_VEC:
                        case ET_VI:
                                rp = right->ex_vec;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = *rp;
                                        rp++;
                                }
                                return (eptr);
                        case ET_SYM:
                        default:
                                post_error((fts_object_t *) e,
                              "expr: FUNC_EVAL(%d): bad right type %ld\n",
                                                      __LINE__, right->ex_type);
                                return (eptr);
                        }
                case ET_FLT:
                        leftvalue = left->ex_flt;
                        switch (right->ex_type) {
                        case ET_INT:
                                rightvalue = right->ex_int;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = rightvalue;
                                }
                                return (eptr);
                        case ET_FLT:
                                rightvalue = right->ex_flt;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = rightvalue;
                                }
                                return (eptr);
                        case ET_VEC:
                        case ET_VI:
                                rp = right->ex_vec;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = *rp;
                                        rp++;
                                }
                                return (eptr);
                        case ET_SYM:
                        default:
                                post_error((fts_object_t *) e,
                              "expr: FUNC_EVAL(%d): bad right type %ld\n",
                                                      __LINE__, right->ex_type);
                                return (eptr);
                        }
                case ET_VEC:
                case ET_VI:
                        lp = left->ex_vec;
                        switch (right->ex_type) {
                        case ET_INT:
                                rightvalue = right->ex_int;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = *lp;
                                        else
                                                *op++ = rightvalue;
                                        lp++;
                                }
                                return (eptr);
                        case ET_FLT:
                                rightvalue = right->ex_flt;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = *lp;
                                        else
                                                *op++ = rightvalue;
                                        lp++;
                                }
                                return (eptr);
                        case ET_VEC:
                        case ET_VI:
                                rp = right->ex_vec;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = *lp;
                                        else
                                                *op++ = *rp;
                                        lp++; rp++;
                                }
                                return (eptr);
                        case ET_SYM:
                        default:
                                post_error((fts_object_t *) e,
                              "expr: FUNC_EVAL(%d): bad right type %ld\n",
                                                      __LINE__, right->ex_type);
                                return (eptr);
                        }
                case ET_SYM:
                default:
                        post_error((fts_object_t *) e,
                      "expr: FUNC_EVAL(%d): bad left type %ld\n",
                                              __LINE__, left->ex_type);
                        return (eptr);
                }
        case ET_INT:
                if (cond->ex_int)
                        condtrue = 1;
                else
                        condtrue = 0;
                break;
        case ET_FLT:
                if (cond->ex_flt)
                        condtrue = 1;
                else
                        condtrue = 0;
                break;
        case ET_SYM:
        default:
                post_error((fts_object_t *) e,
              "expr: FUNC_EVAL(%d): bad condition type %ld\n",
                                      __LINE__, cond->ex_type);
                return (eptr);
        }
                if (condtrue) {
                        eptr = ex_eval(e, eptr, argv, idx);
                        res = argv++;
                        if (!eptr)
                                return (exNULL);
                        eptr = eptr->ex_end; /* no right processing */

                } else {
                        if (!eptr)
                                return (exNULL);
                        eptr = eptr->ex_end; /* no left rocessing */
                        eptr = ex_eval(e, eptr, argv, idx);
                        res = argv++;
                }
        switch(res->ex_type) {
        case ET_INT:
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec, (t_float)res->ex_int,
                                                                e->exp_vsize);
                        return (eptr);
                }
                *optr = *res;
                return (eptr);
        case ET_FLT:
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec, (t_float)res->ex_flt,
                                                                e->exp_vsize);
                        return (eptr);
                }
                *optr = *res;
                return (eptr);
        case ET_VEC:
        case ET_VI:
                if (optr->ex_type != ET_VEC) {
                        if (optr->ex_type == ET_VI) {
                                /* SDY remove this test */
                                post("expr~: Int. error %d", __LINE__);
                                return (eptr);
                        }
                        optr->ex_type = ET_VEC;
                        optr->ex_vec = (t_float *)
                                  fts_malloc(sizeof (t_float) * e->exp_vsize);
                                                if (!optr->ex_vec) {
                                                        post("expr:if: no mem");
                            return (eptr);
                                                }
                }
                memcpy(optr->ex_vec, res->ex_vec, e->exp_vsize*sizeof(t_float));
                return (eptr);
        case ET_SYM:
        default:
                post_error((fts_object_t *) e,
              "expr: FUNC_EVAL(%d): bad res type %ld\n",
                                      __LINE__, res->ex_type);
                return (eptr);
        }

}